

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeTableMoveto(BtCursor *pCur,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  MemPage *pMVar5;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  char cVar9;
  int iVar10;
  u8 *p;
  int iVar11;
  long in_FS_OFFSET;
  i64 nCellKey;
  int local_58;
  int local_54;
  int local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pCur->eState != '\0') || ((pCur->curFlags & 2) == 0)) goto LAB_001503ea;
  lVar6 = (pCur->info).nKey;
  if (lVar6 == intKey) {
    *pRes = 0;
  }
  else {
    if (lVar6 < intKey) {
      if ((pCur->curFlags & 8) == 0) {
        if (lVar6 + 1 == intKey) {
          *pRes = 0;
          iVar7 = sqlite3BtreeNext(pCur,(int)intKey);
          if (iVar7 != 0x65) {
            if (iVar7 != 0) goto LAB_001506a1;
            getCellInfo(pCur);
            local_58 = 0;
            iVar7 = local_58;
            if ((pCur->info).nKey == intKey) goto LAB_001506a1;
          }
        }
        goto LAB_001503ea;
      }
    }
    else {
LAB_001503ea:
      iVar7 = moveToRoot(pCur);
      if (iVar7 != 0x10) {
        if (iVar7 == 0) {
          local_58 = 0;
          do {
            pMVar5 = pCur->pPage;
            iVar11 = pMVar5->nCell - 1;
            iVar10 = iVar11 >> (1U - (char)biasRight & 0x1f);
            local_54 = -0x55555556;
            iVar7 = 0;
            do {
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              p = pMVar5->aDataOfst +
                  (CONCAT11(pMVar5->aCellIdx[(long)iVar10 * 2],
                            pMVar5->aCellIdx[(long)iVar10 * 2 + 1]) & pMVar5->maskPage);
              if (pMVar5->intKeyLeaf == '\0') {
LAB_001504b5:
                sqlite3GetVarint(p,(u64 *)&local_40);
                if ((long)local_40 < intKey) {
                  iVar7 = iVar10 + 1;
                  if (iVar10 < iVar11) {
LAB_001504e7:
                    iVar10 = iVar7 + iVar11 >> 1;
                    cVar9 = '\0';
                  }
                  else {
                    local_54 = -1;
LAB_0015052d:
                    cVar9 = '\x04';
                  }
                }
                else {
                  if (intKey < (long)local_40) {
                    iVar11 = iVar10 + -1;
                    if (iVar7 < iVar10) goto LAB_001504e7;
                    local_54 = 1;
                    goto LAB_0015052d;
                  }
                  pCur->ix = (u16)iVar10;
                  if (pMVar5->leaf != '\0') {
                    pCur->curFlags = pCur->curFlags | 2;
                    (pCur->info).nKey = (i64)local_40;
                    (pCur->info).nSize = 0;
                    *pRes = 0;
                    local_48 = 0;
                    goto LAB_0015051e;
                  }
                  cVar9 = '\b';
                  iVar7 = iVar10;
                }
              }
              else {
                do {
                  if (-1 < (char)*p) {
                    p = p + 1;
                    goto LAB_001504b5;
                  }
                  p = p + 1;
                } while (p < pMVar5->aDataEnd);
                local_48 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b36,
                            "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_0015051e:
                cVar9 = '\x01';
              }
            } while (cVar9 == '\0');
            if (cVar9 == '\b') {
LAB_0015057c:
              if (iVar7 < (int)(uint)pMVar5->nCell) {
                pbVar8 = pMVar5->aData +
                         (ulong)(CONCAT11(pMVar5->aCellIdx[(long)iVar7 * 2],
                                          pMVar5->aCellIdx[(long)iVar7 * 2 + 1]) & pMVar5->maskPage)
                         + 3;
              }
              else {
                pbVar8 = pMVar5->aData + (ulong)pMVar5->hdrOffset + 0xb;
              }
              bVar1 = pbVar8[-3];
              bVar2 = pbVar8[-2];
              bVar3 = pbVar8[-1];
              bVar4 = *pbVar8;
              pCur->ix = (u16)iVar7;
              local_58 = moveToChild(pCur,(uint)bVar4 |
                                          (uint)bVar3 << 8 |
                                          (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18);
              cVar9 = (local_58 != 0) * '\x02';
            }
            else if (cVar9 == '\x04') {
              if (pMVar5->leaf == '\0') goto LAB_0015057c;
              pCur->ix = (u16)iVar10;
              *pRes = local_54;
              cVar9 = '\t';
              local_58 = 0;
            }
          } while (cVar9 == '\0');
          if ((cVar9 == '\t') || (iVar7 = local_48, cVar9 == '\x02')) {
            (pCur->info).nSize = 0;
            iVar7 = local_58;
          }
        }
        goto LAB_001506a1;
      }
    }
    *pRes = -1;
  }
  local_58 = 0;
  iVar7 = local_58;
LAB_001506a1:
  local_58 = iVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTableMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo==0 );
  assert( pCur->eState!=CURSOR_VALID || pCur->curIntKey!=0 );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0 ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        assert( cursorIsAtLastEntry(pCur) || CORRUPT_DB );
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowly. */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc!=SQLITE_DONE ){
          return rc;
        }
      }
    }
  }

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey );

  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    for(;;){
      i64 nCellKey;
      pCell = findCellPastPtr(pPage, idx);
      if( pPage->intKeyLeaf ){
        while( 0x80 <= *(pCell++) ){
          if( pCell>=pPage->aDataEnd ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
        }
      }
      getVarint(pCell, (u64*)&nCellKey);
      if( nCellKey<intKey ){
        lwr = idx+1;
        if( lwr>upr ){ c = -1; break; }
      }else if( nCellKey>intKey ){
        upr = idx-1;
        if( lwr>upr ){ c = +1; break; }
      }else{
        assert( nCellKey==intKey );
        pCur->ix = (u16)idx;
        if( !pPage->leaf ){
          lwr = idx;
          goto moveto_table_next_layer;
        }else{
          pCur->curFlags |= BTCF_ValidNKey;
          pCur->info.nKey = nCellKey;
          pCur->info.nSize = 0;
          *pRes = 0;
          return SQLITE_OK;
        }
      }
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
    }
    assert( lwr==upr+1 || !pPage->leaf );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_table_finish;
    }
moveto_table_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_table_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}